

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O2

void __thiscall Analysis::FlowAnalysis_multistrange_particles(Analysis *this)

{
  shared_ptr<RandomUtil::Random> *psVar1;
  shared_ptr<particleSamples> *psVar2;
  pointer ppsVar3;
  ostream *poVar4;
  bool bVar5;
  singleParticleSpectra *psVar6;
  singleParticleSpectra **ipart;
  pointer ppsVar7;
  ulong uVar8;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> spvn;
  ParameterReader paraRdr;
  singleParticleSpectra *local_480;
  _Vector_base<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> local_478;
  ostream *local_458;
  int local_44c;
  ParameterReader local_448;
  ulong local_418;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_410;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_400;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_3f0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_3e0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_3d0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_3c0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_3b0;
  __shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2> local_3a0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ParameterReader::ParameterReader(&local_448,&this->paraRdr_);
  std::__cxx11::string::string((string *)&local_d0,"compute_correlation",(allocator *)&local_478);
  ParameterReader::setVal(&local_448,&local_d0,0.0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_f0,"flag_charge_dependence",(allocator *)&local_478)
  ;
  ParameterReader::setVal(&local_448,&local_f0,0.0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string((string *)&local_110,"rap_type",(allocator *)&local_478);
  ParameterReader::setVal(&local_448,&local_110,1.0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_130,"rapidity_distribution",(allocator *)&local_478)
  ;
  ParameterReader::setVal(&local_448,&local_130,1.0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string
            ((string *)&local_150,"rapidityPTDistributionFlag",(allocator *)&local_478);
  ParameterReader::setVal(&local_448,&local_150,0.0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string((string *)&local_170,"rap_min",(allocator *)&local_478);
  ParameterReader::setVal(&local_448,&local_170,-0.5);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)&local_190,"rap_max",(allocator *)&local_478);
  ParameterReader::setVal(&local_448,&local_190,0.5);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::string
            ((string *)&local_1b0,"vn_rapidity_dis_pT_min",(allocator *)&local_478);
  ParameterReader::setVal(&local_448,&local_1b0,0.2);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string
            ((string *)&local_1d0,"vn_rapidity_dis_pT_max",(allocator *)&local_478);
  ParameterReader::setVal(&local_448,&local_1d0,3.0);
  std::__cxx11::string::~string((string *)&local_1d0);
  local_478._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_1f0,"particle_monval",(allocator *)&local_480);
  ParameterReader::setVal(&local_448,&local_1f0,3122.0);
  std::__cxx11::string::~string((string *)&local_1f0);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_210,(string *)this);
  psVar1 = &this->ran_gen_ptr_;
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3b0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_448,&local_210,(shared_ptr<RandomUtil::Random> *)&local_3b0);
  local_480 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_478,
             &local_480);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3b0._M_refcount);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string((string *)&local_230,"particle_monval",(allocator *)&local_480);
  ParameterReader::setVal(&local_448,&local_230,-3122.0);
  std::__cxx11::string::~string((string *)&local_230);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_250,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3c0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_448,&local_250,(shared_ptr<RandomUtil::Random> *)&local_3c0);
  local_480 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_478,
             &local_480);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3c0._M_refcount);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string((string *)&local_270,"particle_monval",(allocator *)&local_480);
  ParameterReader::setVal(&local_448,&local_270,3312.0);
  std::__cxx11::string::~string((string *)&local_270);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_290,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3d0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_448,&local_290,(shared_ptr<RandomUtil::Random> *)&local_3d0);
  local_480 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_478,
             &local_480);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3d0._M_refcount);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string((string *)&local_2b0,"particle_monval",(allocator *)&local_480);
  ParameterReader::setVal(&local_448,&local_2b0,-3312.0);
  std::__cxx11::string::~string((string *)&local_2b0);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_2d0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3e0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_448,&local_2d0,(shared_ptr<RandomUtil::Random> *)&local_3e0);
  local_480 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_478,
             &local_480);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3e0._M_refcount);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::string((string *)&local_2f0,"particle_monval",(allocator *)&local_480);
  ParameterReader::setVal(&local_448,&local_2f0,3334.0);
  std::__cxx11::string::~string((string *)&local_2f0);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_310,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3f0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_448,&local_310,(shared_ptr<RandomUtil::Random> *)&local_3f0);
  local_480 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_478,
             &local_480);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3f0._M_refcount);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string((string *)&local_330,"particle_monval",(allocator *)&local_480);
  ParameterReader::setVal(&local_448,&local_330,-3334.0);
  std::__cxx11::string::~string((string *)&local_330);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_350,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_400,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_448,&local_350,(shared_ptr<RandomUtil::Random> *)&local_400);
  local_480 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_478,
             &local_480);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_400._M_refcount);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::string((string *)&local_370,"particle_monval",(allocator *)&local_480);
  ParameterReader::setVal(&local_448,&local_370,333.0);
  std::__cxx11::string::~string((string *)&local_370);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_390,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_410,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_448,&local_390,(shared_ptr<RandomUtil::Random> *)&local_410);
  uVar8 = 0;
  local_480 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_478,
             &local_480);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_410._M_refcount);
  std::__cxx11::string::~string((string *)&local_390);
  psVar2 = &this->particle_list_;
  local_458 = (ostream *)&this->messager;
  while (bVar5 = particleSamples::end_of_file
                           ((psVar2->super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr), ppsVar3 = local_478._M_impl.super__Vector_impl_data._M_finish
        , ppsVar7 = local_478._M_impl.super__Vector_impl_data._M_start, !bVar5) {
    std::operator<<(local_458,"Reading event: ");
    poVar4 = local_458;
    std::ostream::operator<<(local_458,(int)uVar8 + 1);
    std::operator<<(poVar4," ... ");
    std::__cxx11::string::string((string *)&local_50,"info",(allocator *)&local_480);
    pretty_ostream::flush((pretty_ostream *)local_458,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_44c = particleSamples::read_in_particle_samples
                          ((psVar2->super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr);
    std::operator<<(local_458,"nev = ");
    std::ostream::operator<<(local_458,local_44c);
    std::__cxx11::string::string((string *)&local_70,"info",(allocator *)&local_480);
    pretty_ostream::flush((pretty_ostream *)local_458,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_90," processing ...",(allocator *)&local_480);
    local_418 = uVar8;
    pretty_ostream::info((pretty_ostream *)local_458,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    ppsVar3 = local_478._M_impl.super__Vector_impl_data._M_finish;
    for (ppsVar7 = local_478._M_impl.super__Vector_impl_data._M_start; ppsVar7 != ppsVar3;
        ppsVar7 = ppsVar7 + 1) {
      particleSamples::filter_particles_from_events
                ((psVar2->super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 (*ppsVar7)->particle_monval);
      psVar6 = *ppsVar7;
      std::__shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_3a0,&psVar2->super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>
                );
      singleParticleSpectra::calculate_Qn_vector_shell
                (psVar6,(shared_ptr<particleSamples> *)&local_3a0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3a0._M_refcount);
    }
    std::__cxx11::string::string((string *)&local_b0,"done!",(allocator *)&local_480);
    pretty_ostream::info((pretty_ostream *)local_458,&local_b0);
    uVar8 = local_418;
    std::__cxx11::string::~string((string *)&local_b0);
    uVar8 = (ulong)(uint)(local_44c + (int)uVar8);
  }
  for (; ppsVar7 != ppsVar3; ppsVar7 = ppsVar7 + 1) {
    singleParticleSpectra::output_spectra_and_Qn_results(*ppsVar7);
  }
  if (local_478._M_impl.super__Vector_impl_data._M_finish !=
      local_478._M_impl.super__Vector_impl_data._M_start) {
    local_478._M_impl.super__Vector_impl_data._M_finish =
         local_478._M_impl.super__Vector_impl_data._M_start;
  }
  std::_Vector_base<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::
  ~_Vector_base(&local_478);
  ParameterReader::~ParameterReader(&local_448);
  return;
}

Assistant:

void Analysis::FlowAnalysis_multistrange_particles() {
    ParameterReader paraRdr = paraRdr_;
    paraRdr.setVal("compute_correlation", 0);
    paraRdr.setVal("flag_charge_dependence", 0);
    paraRdr.setVal("rap_type", 1);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("rapidityPTDistributionFlag", 0);
    paraRdr.setVal("rap_min", -0.5);
    paraRdr.setVal("rap_max", 0.5);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);

    // first define all the analysis sets
    std::vector<singleParticleSpectra *> spvn;
    paraRdr.setVal("particle_monval", 3122);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -3122);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 3312);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -3312);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 3334);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -3334);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 333);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // start the loop
    int event_id = 0;
    while (!particle_list_->end_of_file()) {
        messager << "Reading event: " << event_id + 1 << " ... ";
        messager.flush("info");
        int nev = particle_list_->read_in_particle_samples();
        messager << "nev = " << nev;
        messager.flush("info");
        messager.info(" processing ...");
        for (auto &ipart : spvn) {
            int particle_monval = ipart->get_monval();
            particle_list_->filter_particles_from_events(particle_monval);
            ipart->calculate_Qn_vector_shell(particle_list_);
        }
        messager.info("done!");
        event_id += nev;
    }
    for (auto &ipart : spvn) ipart->output_spectra_and_Qn_results();
    spvn.clear();
}